

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::GetECHLength
               (SSL_CTX *ctx,size_t *out_client_hello_len,size_t *out_ech_len,size_t max_name_len,
               char *name)

{
  bool bVar1;
  int iVar2;
  evp_hpke_key_st *peVar3;
  EVP_HPKE_KEM *kem;
  SSL_ECH_KEYS *__p;
  pointer psVar4;
  SSL *pSVar5;
  pointer psVar6;
  uchar *in;
  size_t len;
  size_type sVar7;
  Span<unsigned_char> SVar8;
  Span<unsigned_char> local_1a0;
  undefined1 local_190 [8];
  Span<unsigned_char> body;
  uint8_t *unused;
  SSL_CLIENT_HELLO parsed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> client_hello;
  UniquePtr<SSL> ssl;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  size_t local_b8;
  size_t ech_config_len;
  uint8_t *ech_config;
  ScopedEVP_HPKE_KEY key;
  char *name_local;
  size_t max_name_len_local;
  size_t *out_ech_len_local;
  size_t *out_client_hello_len_local;
  SSL_CTX *ctx_local;
  
  key.ctx_._104_8_ = name;
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&ech_config);
  peVar3 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&ech_config);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(peVar3,kem);
  if (iVar2 != 0) {
    peVar3 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&ech_config);
    iVar2 = SSL_marshal_ech_config
                      ((uint8_t **)&ech_config_len,&local_b8,'\x01',peVar3,"public.example",
                       max_name_len);
    if (iVar2 != 0) {
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&keys,(pointer)ech_config_len)
      ;
      __p = SSL_ECH_KEYS_new();
      std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&ssl,__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl);
      if (bVar1) {
        psVar4 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&ssl);
        peVar3 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&ech_config);
        iVar2 = SSL_ECH_KEYS_add(psVar4,1,(uint8_t *)ech_config_len,local_b8,peVar3);
        if (iVar2 == 0) goto LAB_00189f2e;
        pSVar5 = SSL_new((SSL_CTX *)ctx);
        std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_st,bssl::internal::Deleter> *)
                   &client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(pointer)pSVar5);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)
                           &client_hello.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                              &client_hello.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          psVar4 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&ssl);
          bVar1 = InstallECHConfigList(psVar6,psVar4);
          if (!bVar1) goto LAB_0018a01a;
          if (key.ctx_._104_8_ != 0) {
            psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                &client_hello.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            iVar2 = SSL_set_tlsext_host_name(psVar6,(char *)key.ctx_._104_8_);
            if (iVar2 == 0) goto LAB_0018a01a;
          }
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &client_hello.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          SSL_set_connect_state(pSVar5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&parsed.extensions_len
                    );
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                              &client_hello.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = GetClientHello(psVar6,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &parsed.extensions_len);
          if (bVar1) {
            Span<unsigned_char>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      (&local_1a0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &parsed.extensions_len);
            SVar8 = Span<unsigned_char>::subspan(&local_1a0,9,0xffffffffffffffff);
            body.data_ = (uchar *)SVar8.size_;
            local_190 = (undefined1  [8])SVar8.data_;
            psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                &client_hello.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            in = Span<unsigned_char>::data((Span<unsigned_char> *)local_190);
            len = Span<unsigned_char>::size((Span<unsigned_char> *)local_190);
            iVar2 = SSL_parse_client_hello(psVar6,(SSL_CLIENT_HELLO *)&unused,in,len);
            if ((iVar2 == 0) ||
               (iVar2 = SSL_early_callback_ctx_extension_get
                                  ((SSL_CLIENT_HELLO *)&unused,0xfe0d,(uint8_t **)&body.size_,
                                   out_ech_len), iVar2 == 0)) {
              ctx_local._7_1_ = false;
            }
            else {
              sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &parsed.extensions_len);
              *out_client_hello_len = sVar7;
              ctx_local._7_1_ = true;
            }
          }
          else {
            ctx_local._7_1_ = false;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&parsed.extensions_len
                    );
        }
        else {
LAB_0018a01a:
          ctx_local._7_1_ = false;
        }
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                   &client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
LAB_00189f2e:
        ctx_local._7_1_ = false;
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&ssl);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&keys);
      goto LAB_0018a25b;
    }
  }
  ctx_local._7_1_ = false;
LAB_0018a25b:
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&ech_config);
  return ctx_local._7_1_;
}

Assistant:

static bool GetECHLength(SSL_CTX *ctx, size_t *out_client_hello_len,
                         size_t *out_ech_len, size_t max_name_len,
                         const char *name) {
  bssl::ScopedEVP_HPKE_KEY key;
  uint8_t *ech_config;
  size_t ech_config_len;
  if (!EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()) ||
      !SSL_marshal_ech_config(&ech_config, &ech_config_len,
                              /*config_id=*/1, key.get(), "public.example",
                              max_name_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  if (!keys || !SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                                 ech_config_len, key.get())) {
    return false;
  }

  bssl::UniquePtr<SSL> ssl(SSL_new(ctx));
  if (!ssl || !InstallECHConfigList(ssl.get(), keys.get()) ||
      (name != nullptr && !SSL_set_tlsext_host_name(ssl.get(), name))) {
    return false;
  }
  SSL_set_connect_state(ssl.get());

  std::vector<uint8_t> client_hello;
  SSL_CLIENT_HELLO parsed;
  const uint8_t *unused;
  if (!GetClientHello(ssl.get(), &client_hello)) {
    return false;
  }
  // Skip record and handshake headers. This assumes the ClientHello
  // fits in one record.
  auto body =
      Span(client_hello).subspan(SSL3_RT_HEADER_LENGTH + SSL3_HM_HEADER_LENGTH);
  if (!SSL_parse_client_hello(ssl.get(), &parsed, body.data(), body.size()) ||
      !SSL_early_callback_ctx_extension_get(
          &parsed, TLSEXT_TYPE_encrypted_client_hello, &unused, out_ech_len)) {
    return false;
  }
  *out_client_hello_len = client_hello.size();
  return true;
}